

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O1

string * pstore::file::file_handle::get_temporary_directory_abi_cxx11_(void)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  string *in_RDI;
  
  pcVar2 = getenv("TMPDIR");
  if (pcVar2 == (char *)0x0) {
    lVar1 = 8;
    do {
      lVar3 = lVar1;
      if (lVar3 == 0x20) goto LAB_0011e432;
      pcVar2 = getenv(*(char **)((long)get_temporary_directory::env_var_names._M_elems + lVar3));
      lVar1 = lVar3 + 8;
    } while (pcVar2 == (char *)0x0);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>();
    if (lVar3 != 0x20) {
      return in_RDI;
    }
LAB_0011e432:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    strlen(pcVar2);
  }
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string file_handle::get_temporary_directory () {
            // Following boost filesystem, we check some select environment variables
            // for user temporary directories before resorting to /tmp.
            static constexpr std::array<gsl::czstring, 4> env_var_names{{
                "TMPDIR",
                "TMP",
                "TEMP",
                "TEMPDIR",
            }};
            for (gsl::czstring const name : env_var_names) {
                if (gsl::czstring const val = std::getenv (name)) {
                    return val;
                }
            }
            return "/tmp";
        }